

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O1

void InsertMacro(CMacro *Macro,wstring *Args)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t num;
  tTextData Text;
  ArgumentList Arguments;
  wstring local_e8;
  wstring local_c8;
  wstring local_a8;
  ArgumentList local_88;
  SymbolTable *local_70;
  size_t local_68;
  wstring local_60;
  ulong local_40;
  unsigned_long local_38;
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = L'\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = L'\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = L'\0';
  local_88.entries.super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.entries.super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.entries.super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  splitArguments(&local_88,Args);
  uVar4 = ((long)local_88.entries.
                 super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_88.entries.
                 super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar5 = (ulong)(int)uVar4;
  uVar6 = (long)(Macro->arguments).
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(Macro->arguments).
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar5 == uVar6) {
    Global.MacroNestingLevel = Global.MacroNestingLevel + 1;
    if (Global.MacroNestingLevel == 0x80) {
      Logger::printError<>(Error,L"Maximum macro nesting level reached");
    }
    else {
      pbVar1 = (Macro->lines).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_68 = Macro->counter;
      Macro->counter = local_68 + 1;
      if (pbVar1 != (Macro->lines).
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        num = 0;
        local_70 = &Global.symbolTable;
        do {
          CMacro::getLine_abi_cxx11_(&local_60,Macro,num,&local_88,local_68);
          std::__cxx11::wstring::operator=((wstring *)&local_e8,(wstring *)&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          SymbolTable::insertEquations
                    (&local_60,local_70,&local_e8,Global.FileInfo.FileNum,Global.Section);
          std::__cxx11::wstring::operator=((wstring *)&local_e8,(wstring *)&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          bVar2 = CheckEquLabel(&local_e8);
          if (!bVar2) {
            checkLabel(&local_60,&local_e8,false);
            std::__cxx11::wstring::operator=((wstring *)&local_e8,(wstring *)&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p);
            }
            splitLine(&local_e8,&local_c8,&local_a8);
            if (local_c8._M_string_length != 0) {
              if (Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  Global.Macros.super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar5 = 0;
                bVar2 = false;
                do {
                  iVar3 = std::__cxx11::wstring::compare((wstring *)&local_c8);
                  if (iVar3 == 0) {
                    bVar2 = true;
                    InsertMacro(Global.Macros.
                                super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar5],&local_a8);
                  }
                  uVar5 = uVar5 + 1;
                } while (uVar5 < (ulong)((long)Global.Macros.
                                               super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)Global.Macros.
                                               super__Vector_base<CMacro_*,_std::allocator<CMacro_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3));
                if (bVar2) goto LAB_0013e450;
              }
              iVar3 = (*Arch->_vptr_CArchitecture[1])(Arch,&local_c8,&local_a8);
              if ((char)iVar3 == '\0') {
                (**Arch->_vptr_CArchitecture)(Arch,&local_c8,&local_a8);
              }
            }
          }
LAB_0013e450:
          num = num + 1;
        } while (num < (ulong)((long)(Macro->lines).
                                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(Macro->lines).
                                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      Global.MacroNestingLevel = Global.MacroNestingLevel + -1;
    }
  }
  else {
    local_60._M_dataplus._M_p = L"Not enough";
    if (uVar6 < uVar5) {
      local_60._M_dataplus._M_p = L"Too many";
    }
    local_40 = uVar6;
    local_38 = uVar4;
    Logger::printError<wchar_t_const*,unsigned_long,unsigned_long>
              (Error,L"%s macro arguments (%d vs %d)",(wchar_t **)&local_60,&local_38,&local_40);
  }
  std::vector<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>::~vector(&local_88.entries)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void InsertMacro(CMacro* Macro, std::wstring& Args)
{
	tTextData Text;
	ArgumentList Arguments;

	splitArguments(Arguments,Args);

	if ((int)Arguments.size() != Macro->getArgumentCount())
	{
		Logger::printError(Logger::Error,L"%s macro arguments (%d vs %d)",
			(int)Arguments.size() > Macro->getArgumentCount() ? L"Too many" : L"Not enough",
			Arguments.size(),Macro->getArgumentCount());
		return;
	}

	Global.MacroNestingLevel++;
	if (Global.MacroNestingLevel == ASSEMBLER_MACRO_NESTING_LEVEL)
	{
		Logger::printError(Logger::Error,L"Maximum macro nesting level reached");
		return;
	}

	size_t MacroCounter = Macro->getIncreaseCounter();

	for (size_t i = 0; i < Macro->getLineCount(); i++)
	{
		Text.buffer = Macro->getLine(i,Arguments,MacroCounter);
		Text.buffer = Global.symbolTable.insertEquations(Text.buffer,Global.FileInfo.FileNum,Global.Section);

		if (CheckEquLabel(Text.buffer) == false)
		{
			Text.buffer = checkLabel(Text.buffer,false);
			splitLine(Text.buffer,Text.name,Text.params);
			if (Text.name.size() == 0) continue;

			bool macro = false;
			for (size_t i = 0; i < Global.Macros.size(); i++)
			{
				if (Text.name.compare(Global.Macros[i]->getName()) == 0)
				{
					InsertMacro(Global.Macros[i],Text.params);
					macro = true;
				}
			}
			if (macro == true) continue;

			if (Arch->AssembleDirective(Text.name,Text.params) == false)
			{
				Arch->AssembleOpcode(Text.name,Text.params);
			}
		}
	}
	Global.MacroNestingLevel--;
}